

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::XThreadEvent::ensureDoneOrCanceled(XThreadEvent *this)

{
  char cVar1;
  anon_enum_32 aVar2;
  Waiter *pWVar3;
  XThreadEvent *pXVar4;
  Executor *pEVar5;
  Maybe<kj::_::XThreadEvent_&> MVar6;
  long in_FS_OFFSET;
  Locked<kj::Executor::Impl::State> lock;
  PredicateImpl impl;
  Locked<kj::Executor::Impl::State> selfLock;
  undefined1 local_a8 [16];
  undefined1 local_98 [40];
  Maybe<kj::_::XThreadEvent_&> local_70;
  MutexGuarded<kj::Executor::Impl::State> *local_68;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:959:11)>
  local_60;
  Maybe<kj::_::XThreadEvent_&> local_48;
  Maybe<kj::_::XThreadEvent_&> local_40;
  Maybe<kj::_::Mutex::Waiter_&> local_38;
  
  if (this->state != DONE) {
    MutexGuarded<kj::Executor::Impl::State>::lockExclusive
              ((MutexGuarded<kj::Executor::Impl::State> *)local_a8,
               (((this->targetExecutor).ptr)->impl).ptr);
    MVar6.ptr = (XThreadEvent *)((Maybe<kj::_::Mutex::Waiter_&> *)local_a8._8_8_)->ptr;
    if (MVar6.ptr == (XThreadEvent *)0x0) {
      local_98._0_8_ = &PTR_check_006737e8;
      local_98._16_8_ = local_a8._8_8_;
      local_60.maybeFunc.ptr.isSet = false;
      local_98._8_8_ = (MutexGuarded<kj::Executor::Impl::State> *)(local_98 + 0x20);
      local_98._32_8_ = this;
      Mutex::wait((Mutex *)local_a8._0_8_,local_98);
    }
    else {
      aVar2 = this->state;
      if (aVar2 == QUEUED) {
        List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
                  ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)
                   (local_a8._8_8_ + 8),(char *)this);
        this->state = DONE;
      }
      else if (aVar2 == EXECUTING) {
        List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
                  ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)
                   &(((Waiter *)(local_a8._8_8_ + 0x30))->exception).ptr.ptr,(char *)this);
        List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::add
                  ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)
                   &(((Maybe<kj::Own<kj::Exception,_std::nullptr_t>_> *)(local_a8._8_8_ + 0x18))->
                    ptr).ptr,this);
        this->state = CANCELING;
        pWVar3 = (Waiter *)
                 ((MVar6.ptr)->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember;
        if (pWVar3 != (Waiter *)0x0) {
          (*(code *)(((pWVar3->next).ptr)->exception).ptr.disposer)();
        }
        if ((*(long *)(in_FS_OFFSET + -0x28) == 0) ||
           (pXVar4 = *(XThreadEvent **)(*(long *)(in_FS_OFFSET + -0x28) + 0x48),
           pXVar4 == (XThreadEvent *)0x0)) {
          local_98._0_8_ = &PTR_check_00673848;
          local_98._16_8_ = local_a8._8_8_;
          local_60.maybeFunc.ptr.isSet = false;
          local_98._8_8_ = (MutexGuarded<kj::Executor::Impl::State> *)(local_98 + 0x20);
          local_98._32_8_ = this;
          Mutex::wait((Mutex *)local_a8._0_8_,local_98);
        }
        else {
          local_60.maybeFunc.ptr.isSet = true;
          local_60.maybeFunc.ptr.field_1.value.lock =
               (Locked<kj::Executor::Impl::State> *)(XThreadEvent *)local_a8;
          local_60.maybeFunc.ptr.field_1.value.selfExecutor = (Executor *)pXVar4;
          local_48.ptr = MVar6.ptr;
          while (this->state != DONE) {
            cVar1 = *(char *)&(((Waiter *)(local_a8._8_8_ + 0x60))->exception).ptr.ptr;
            local_98._0_8_ = (Exception *)0x0;
            local_98._8_8_ = (EventLoop *)0x0;
            Locked<kj::Executor::Impl::State>::operator=
                      ((Locked<kj::Executor::Impl::State> *)local_a8,
                       (Locked<kj::Executor::Impl::State> *)local_98);
            Locked<kj::Executor::Impl::State>::~Locked
                      ((Locked<kj::Executor::Impl::State> *)local_98);
            local_98._0_8_ = (Exception *)0x0;
            local_98._8_8_ = (EventLoop *)0x0;
            local_98._16_8_ = (XThreadEvent *)0x0;
            local_98._24_8_ = &NullArrayDisposer::instance;
            local_98[0x20] = 1;
            local_70.ptr = pXVar4;
            local_68 = (MutexGuarded<kj::Executor::Impl::State> *)local_98;
            MutexGuarded<kj::Executor::Impl::State>::lockExclusive
                      ((MutexGuarded<kj::Executor::Impl::State> *)&local_40,
                       (pXVar4->super_Event)._vptr_Event);
            *(undefined1 *)&local_38.ptr[2].exception.ptr.ptr = 1;
            Executor::Impl::State::dispatchCancels
                      ((State *)local_38.ptr,(Vector<kj::_::XThreadEvent_*> *)local_98);
            Locked<kj::Executor::Impl::State>::~Locked
                      ((Locked<kj::Executor::Impl::State> *)&local_40);
            Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:981:15)>
            ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:981:15)>
                         *)(local_98 + 0x20));
            ArrayBuilder<kj::_::XThreadEvent_*>::dispose
                      ((ArrayBuilder<kj::_::XThreadEvent_*> *)local_98);
            if (cVar1 != '\0') {
              sched_yield();
            }
            MutexGuarded<kj::Executor::Impl::State>::lockExclusive
                      ((MutexGuarded<kj::Executor::Impl::State> *)local_98,
                       (((this->targetExecutor).ptr)->impl).ptr);
            Locked<kj::Executor::Impl::State>::operator=
                      ((Locked<kj::Executor::Impl::State> *)local_a8,
                       (Locked<kj::Executor::Impl::State> *)local_98);
            Locked<kj::Executor::Impl::State>::~Locked
                      ((Locked<kj::Executor::Impl::State> *)local_98);
            local_98._0_8_ = &PTR_check_00673818;
            local_98._16_8_ = local_a8._8_8_;
            local_98._32_8_ = local_98._32_8_ & 0xffffffffffffff00;
            local_98._8_8_ = (MutexGuarded<kj::Executor::Impl::State> *)&local_40;
            local_40.ptr = this;
            Mutex::wait((Mutex *)local_a8._0_8_,(MutexGuarded<kj::Executor::Impl::State> *)local_98)
            ;
          }
          Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:959:11)>
          ::~Deferred(&local_60);
          MVar6.ptr = local_48.ptr;
        }
      }
      else if (aVar2 == CANCELING) {
        Debug::Fault::Fault<kj::Exception::Type,char_const(&)[69]>
                  ((Fault *)local_98,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                   ,0x403,FAILED,(char *)0x0,
                   "\"impossible state: CANCELING should only be set within the above case\"",
                   (char (*) [69])
                   "impossible state: CANCELING should only be set within the above case");
        Debug::Fault::fatal((Fault *)local_98);
      }
    }
    Locked<kj::Executor::Impl::State>::~Locked((Locked<kj::Executor::Impl::State> *)local_a8);
    if (MVar6.ptr == (XThreadEvent *)0x0) {
      return;
    }
  }
  pEVar5 = (this->replyExecutor).ptr;
  if ((pEVar5 != (Executor *)0x0) && ((this->replyLink).prev != (Maybe<kj::_::XThreadEvent_&> *)0x0)
     ) {
    MutexGuarded<kj::Executor::Impl::State>::lockExclusive
              ((MutexGuarded<kj::Executor::Impl::State> *)local_98,(pEVar5->impl).ptr);
    List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>::remove
              ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink> *)(local_98._8_8_ + 0x38)
               ,(char *)this);
    Locked<kj::Executor::Impl::State>::~Locked((Locked<kj::Executor::Impl::State> *)local_98);
  }
  return;
}

Assistant:

void XThreadEvent::ensureDoneOrCanceled() {
  if (__atomic_load_n(&state, __ATOMIC_ACQUIRE) != DONE) {
    auto lock = targetExecutor->impl->state.lockExclusive();

    const EventLoop* loop;
    KJ_IF_SOME(l, lock->loop) {
      loop = &l;
    } else {
      // Target event loop is already dead, so we know it's already working on transitioning all
      // events to the DONE state. We can just wait.
      lock.wait([&](auto&) { return state == DONE; });
      return;
    }

    switch (state) {
      case UNUSED:
        // Nothing to do.
        break;
      case QUEUED:
        lock->start.remove(*this);
        // No wake needed since we removed work rather than adding it.
        state = DONE;
        break;
      case EXECUTING: {
        lock->executing.remove(*this);
        lock->cancel.add(*this);
        state = CANCELING;
        KJ_IF_SOME(p, loop->port) {
          p.wake();
        }

        Maybe<Executor&> maybeSelfExecutor = kj::none;
        if (threadLocalEventLoop != nullptr) {
          KJ_IF_SOME(e, threadLocalEventLoop->executor) {
            maybeSelfExecutor = *e;
          }
        }

        KJ_IF_SOME(selfExecutor, maybeSelfExecutor) {
          // If, while waiting for other threads to process our cancellation request, we have
          // cancellation requests queued back to this thread, we must process them. Otherwise,
          // we could deadlock with two threads waiting on each other to process cancellations.
          //
          // We don't have a terribly good way to detect this, except to check if the remote
          // thread is itself waiting for cancellations and, if so, wake ourselves up to check for
          // cancellations to process. This will busy-loop but at least it should eventually
          // resolve assuming fair scheduling.
          //
          // To make things extra-annoying, in order to update our waitingForCancel flag, we have
          // to lock our own executor state, but we can't take both locks at once, so we have to
          // release the other lock in the meantime.

          // Make sure we unset waitingForCancel on the way out.
          KJ_DEFER({
            lock = {};

            Vector<_::XThreadEvent*> eventsToCancelOutsideLock;
            KJ_DEFER(selfExecutor.impl->processAsyncCancellations(eventsToCancelOutsideLock));

            auto selfLock = selfExecutor.impl->state.lockExclusive();
            selfLock->waitingForCancel = false;
            selfLock->dispatchCancels(eventsToCancelOutsideLock);

            // We don't need to re-take the lock on the other executor here; it's not used again
            // after this scope.
          });

          while (state != DONE) {
            bool otherThreadIsWaiting = lock->waitingForCancel;

            // Make sure our waitingForCancel is on and dispatch any pending cancellations on this
            // thread.
            lock = {};
            {
              Vector<_::XThreadEvent*> eventsToCancelOutsideLock;
              KJ_DEFER(selfExecutor.impl->processAsyncCancellations(eventsToCancelOutsideLock));

              auto selfLock = selfExecutor.impl->state.lockExclusive();
              selfLock->waitingForCancel = true;

              // Note that we don't have to proactively delete the PromiseNodes extracted from
              // the canceled events because those nodes belong to this thread and can't possibly
              // continue executing while we're blocked here.
              selfLock->dispatchCancels(eventsToCancelOutsideLock);
            }

            if (otherThreadIsWaiting) {
              // We know the other thread was waiting for cancellations to complete a moment ago.
              // We may have just processed the necessary cancellations in this thread, in which
              // case the other thread needs a chance to receive control and notice this. Or, it
              // may be that the other thread is waiting for some third thread to take action.
              // Either way, we should yield control here to give things a chance to settle.
              // Otherwise we could end up in a tight busy loop.
#if _WIN32
              Sleep(0);
#else
              sched_yield();
#endif
            }

            // OK now we can take the original lock again.
            lock = targetExecutor->impl->state.lockExclusive();

            // OK, now we can wait for the other thread to either process our cancellation or
            // indicate that it is waiting for remote cancellation.
            lock.wait([&](const Executor::Impl::State& executorState) {
              return state == DONE || executorState.waitingForCancel;
            });
          }
        } else {
          // We have no executor of our own so we don't have to worry about cancellation cycles
          // causing deadlock.
          //
          // NOTE: I don't think we can actually get here, because it implies that this is a
          //   synchronous execution, which means there's no way to cancel it.
          lock.wait([&](auto&) { return state == DONE; });
        }
        KJ_DASSERT(!targetLink.isLinked());
        break;
      }
      case CANCELING:
        KJ_FAIL_ASSERT("impossible state: CANCELING should only be set within the above case");
      case DONE:
        // Became done while we waited for lock. Nothing to do.
        break;
    }